

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

sexp_conflict
sexp_bit_and(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x,sexp_conflict y)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict y2;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict x2;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  sexp_sint_t i;
  sexp_sint_t leny;
  sexp_sint_t lenx;
  sexp_sint_t len;
  ulong local_b0;
  sexp_conflict in_stack_ffffffffffffff60;
  sexp_conflict ctx_00;
  sexp_conflict ctx_01;
  sexp_conflict local_88;
  undefined1 local_80 [24];
  undefined8 local_68 [2];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  local_58 = &DAT_0000043e;
  memset(local_68,0,0x10);
  local_80._16_8_ = 0x43e;
  memset(local_80,0,0x10);
  local_88 = (sexp_conflict)0x43e;
  memset(&stack0xffffffffffffff68,0,0x10);
  if (((in_RCX & 1) == 1) && ((in_R8 & 1) == 1)) {
    local_8 = in_RCX & in_R8;
  }
  else if (((in_RCX & 1) == 1) && (((in_R8 & 3) == 0 && (((sexp)in_R8)->tag == 0xc)))) {
    local_8 = sexp_bit_and((sexp_conflict)in_RSI,(sexp_conflict)in_RDX,in_RCX,(sexp_conflict)in_R8,
                           (sexp_conflict)in_stack_ffffffffffffffc8);
  }
  else if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xc)) {
    local_68[0] = &stack0xffffffffffffffa8;
    local_68[1] = *(undefined8 *)(in_RDI + 0x6080);
    *(undefined8 **)(in_RDI + 0x6080) = local_68;
    local_80._0_8_ = local_80 + 0x10;
    local_80._8_8_ = *(undefined8 *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = local_80;
    ctx_00 = (sexp_conflict)&local_88;
    ctx_01 = *(sexp_conflict *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff68;
    local_80._16_8_ = sexp_twos_complement(ctx_00,in_stack_ffffffffffffff60);
    local_88 = sexp_twos_complement(ctx_00,in_stack_ffffffffffffff60);
    if ((((ulong)local_88 & 1) == 1) &&
       (auVar2._8_8_ = (long)local_88 >> 0x3f, auVar2._0_8_ = (ulong)local_88 & 0xfffffffffffffffe,
       SUB168(auVar2 / SEXT816(2),0) < 0)) {
      local_88 = sexp_fixnum_to_twos_complement
                           (ctx_01,ctx_00,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    }
    if (((ulong)local_88 & 1) == 1) {
      auVar3._8_8_ = (long)local_88 >> 0x3f;
      auVar3._0_8_ = (ulong)local_88 & 0xfffffffffffffffe;
      local_58 = (SUB168(auVar3 / SEXT816(2),0) &
                 (((anon_union_24768_35_b8e82fc1_for_value *)(local_80._16_8_ + 8))->string).length)
                 << 1 | 1;
    }
    else if ((((ulong)local_88 & 3) == 0) && (local_88->tag == 0xc)) {
      local_40 = (((anon_union_24768_35_b8e82fc1_for_value *)(local_80._16_8_ + 8))->fileno).fd;
      local_48 = (local_88->value).fileno.fd;
      if ((long)local_48 < (long)local_40) {
        local_58 = sexp_copy_bignum(in_RDI,0,local_80._16_8_);
      }
      else {
        local_58 = sexp_copy_bignum(in_RDI,0,local_88);
      }
      local_50 = (sexp)0x0;
      lVar1 = (((sexp)local_58)->value).fileno.fd;
      for (; (long)local_50 < lVar1; local_50 = (long)&((sexp)local_50)->tag + 1) {
        if ((long)local_50 < (long)local_40) {
          uVar7 = *(ulong *)((long)(local_80._16_8_ + 8) + local_50 * 8 + 0x10);
        }
        else {
          iVar6 = 0;
          if (((anon_union_24768_35_b8e82fc1_for_value *)(local_80._16_8_ + 8))->flonum_bits[0] <
              '\0') {
            iVar6 = -1;
          }
          uVar7 = (ulong)iVar6;
        }
        if ((long)local_50 < (long)local_48) {
          local_b0 = *(ulong *)((long)&local_88->value + local_50 * 8 + 0x10);
        }
        else {
          iVar6 = 0;
          if ((local_88->value).flonum_bits[0] < '\0') {
            iVar6 = -1;
          }
          local_b0 = (ulong)iVar6;
        }
        *(ulong *)((long)&((sexp)local_58)->value + local_50 * 8 + 0x10) = uVar7 & local_b0;
      }
      if (((((anon_union_24768_35_b8e82fc1_for_value *)(local_80._16_8_ + 8))->flonum_bits[0] < '\0'
           ) || ((local_88->value).flonum_bits[0] < '\0')) &&
         (*(long *)((long)&((sexp)local_58)->value + lVar1 * 8 + 8) < 0)) {
        sexp_set_twos_complement((sexp_conflict)local_58);
        if ('\0' < (((sexp)local_58)->value).flonum_bits[0]) {
          if (((local_58 & 3) == 0) && (((sexp)local_58)->tag == 0xc)) {
            (((sexp)local_58)->value).flonum_bits[0] = -(((sexp)local_58)->value).flonum_bits[0];
          }
          else if ((local_58 & 1) == 1) {
            auVar4._8_8_ = (long)local_58 >> 0x3f;
            auVar4._0_8_ = local_58 & 0xfffffffffffffffe;
            local_58 = SUB168(auVar4 / SEXT816(2),0) * -2 | 1;
          }
        }
      }
      else if ((((sexp)local_58)->value).flonum_bits[0] < '\0') {
        if (((local_58 & 3) == 0) && (((sexp)local_58)->tag == 0xc)) {
          (((sexp)local_58)->value).flonum_bits[0] = -(((sexp)local_58)->value).flonum_bits[0];
        }
        else if ((local_58 & 1) == 1) {
          auVar5._8_8_ = (long)local_58 >> 0x3f;
          auVar5._0_8_ = local_58 & 0xfffffffffffffffe;
          local_58 = SUB168(auVar5 / SEXT816(2),0) * -2 | 1;
        }
      }
    }
    else {
      local_58 = sexp_type_exception(in_RDI,in_RSI,2,local_88);
    }
    *(undefined8 *)(in_RDI + 0x6080) = local_68[1];
    local_8 = sexp_bignum_normalize(local_58);
  }
  else {
    local_8 = sexp_type_exception(in_RDI,in_RSI,2,in_RCX);
  }
  return (sexp_conflict)local_8;
}

Assistant:

sexp sexp_bit_and (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp y) {
#if SEXP_USE_BIGNUMS
  sexp_sint_t len, lenx, leny, i;
#endif
  sexp_gc_var3(res, x2, y2);
  if (sexp_fixnump(x) && sexp_fixnump(y)) {
    return (sexp) ((sexp_uint_t)x & (sexp_uint_t)y);  /* safe to AND tags */
#if SEXP_USE_BIGNUMS
  } else if (sexp_fixnump(x) && sexp_bignump(y)) {
    return sexp_bit_and(ctx, self, n, y, x);
  } else if (sexp_bignump(x)) {
    sexp_gc_preserve3(ctx, res, x2, y2);
    x2 = sexp_twos_complement(ctx, x);
    y2 = sexp_twos_complement(ctx, y);
    if (sexp_fixnump(y2) && sexp_unbox_fixnum(y2) < 0)
      y2 = sexp_fixnum_to_twos_complement(ctx, y2, sexp_bignum_length(x2));
    if (sexp_fixnump(y2)) {
      res = sexp_make_fixnum(sexp_unbox_fixnum(y2) & sexp_bignum_data(x2)[0]);
    } else if (sexp_bignump(y2)) {
      lenx = sexp_bignum_length(x2);
      leny = sexp_bignum_length(y2);
      if (leny < lenx)
        res = sexp_copy_bignum(ctx, NULL, x2, 0);
      else
        res = sexp_copy_bignum(ctx, NULL, y2, 0);
      for (i=0, len=sexp_bignum_length(res); i<len; i++)
        sexp_bignum_data(res)[i]
          = (i<lenx ? sexp_bignum_data(x2)[i] : sexp_bignum_sign(x2) < 0 ? -1 : 0) &
            (i<leny ? sexp_bignum_data(y2)[i] : sexp_bignum_sign(y2) < 0 ? -1 : 0);
      if ((sexp_bignum_sign(x2) < 0 || sexp_bignum_sign(y2) < 0) && ((sexp_sint_t)(sexp_bignum_data(res)[len-1])) < 0) {
        sexp_set_twos_complement(res);
        if (sexp_bignum_sign(res) > 0) {
          sexp_negate_exact(res);
        }
      } else if (sexp_bignum_sign(res) < 0) {
        sexp_negate_exact(res);
      }
    } else {
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y2);
    }
    sexp_gc_release3(ctx);
    return sexp_bignum_normalize(res);
#endif
  } else {
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
}